

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O2

size_t VP8EstimateTokenSize(VP8TBuffer *b,uint8_t *probas)

{
  ushort uVar1;
  VP8Tokens *pVVar2;
  size_t sVar3;
  VP8Tokens *pVVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  sVar3 = 0;
  pVVar2 = b->pages;
  while (pVVar4 = pVVar2, pVVar4 != (VP8Tokens *)0x0) {
    if (pVVar4->next == (VP8Tokens *)0x0) {
      lVar6 = (long)b->left;
    }
    else {
      lVar6 = 0;
    }
    for (lVar7 = (long)b->page_size; pVVar2 = pVVar4->next, lVar6 < lVar7; lVar7 = lVar7 + -1) {
      uVar1 = *(ushort *)((long)&pVVar4->next + lVar7 * 2 + 6);
      if ((uVar1 >> 0xe & 1) == 0) {
        uVar5 = (uint)(byte)((byte)((uint)(int)(short)uVar1 >> 0xf) ^ probas[uVar1 & 0x3fff]);
      }
      else {
        uVar5 = (uint)(int)(short)uVar1 >> 0xf ^ (uint)uVar1;
      }
      sVar3 = sVar3 + VP8EntropyCost[uVar5 & 0xff];
    }
  }
  return sVar3;
}

Assistant:

size_t VP8EstimateTokenSize(VP8TBuffer* const b, const uint8_t* const probas) {
  size_t size = 0;
  const VP8Tokens* p = b->pages;
  assert(!b->error);
  while (p != NULL) {
    const VP8Tokens* const next = p->next;
    const int N = (next == NULL) ? b->left : 0;
    int n = b->page_size;
    const token_t* const tokens = TOKEN_DATA(p);
    while (n-- > N) {
      const token_t token = tokens[n];
      const int bit = token & (1 << 15);
      if (token & FIXED_PROBA_BIT) {
        size += VP8BitCost(bit, token & 0xffu);
      } else {
        size += VP8BitCost(bit, probas[token & 0x3fffu]);
      }
    }
    p = next;
  }
  return size;
}